

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

int __thiscall
QAnimationGroup::indexOfAnimation(QAnimationGroup *this,QAbstractAnimation *animation)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = *(long *)(*(long *)(this + 8) + 0xb0);
  if (lVar2 != 0) {
    iVar3 = -1;
    lVar4 = 0;
    while (lVar2 << 3 != lVar4) {
      iVar3 = iVar3 + 1;
      plVar1 = (long *)(*(long *)(*(long *)(this + 8) + 0xa8) + lVar4);
      lVar4 = lVar4 + 8;
      if ((QAbstractAnimation *)*plVar1 == animation) {
        return iVar3;
      }
    }
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }